

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  char *pcVar2;
  char **ppcVar3;
  char **ppcVar4;
  char **__stream;
  int iVar5;
  yang_token yVar6;
  int iVar7;
  FILE *__stream_00;
  char *pcVar8;
  FILE *pFVar9;
  int *piVar10;
  char *pcVar11;
  char *pcVar12;
  FILE *pFVar13;
  FILE *in;
  long lVar14;
  ulong uVar15;
  long lVar16;
  char *local_90;
  char *prefix;
  char **import_prefixes;
  char *name_space;
  yang_arg local_6c;
  FILE *local_68;
  FILE *local_60;
  yang_arg local_58;
  uint local_54;
  char **ppcStack_50;
  int import_count;
  char **import_modules;
  char *local_40;
  char *buf;
  int buf_len;
  
  if (argc == 1) {
    pcVar11 = ".";
    __stream_00 = (FILE *)0x0;
LAB_00101410:
    pFVar9 = (FILE *)0x0;
  }
  else {
    if (argc == 3) {
      pcVar11 = argv[1];
      pcVar12 = argv[2];
      if (pcVar11 != (char *)0x0) goto LAB_00101352;
      pcVar11 = ".";
      __stream_00 = (FILE *)0x0;
    }
    else {
      if (argc != 2) {
        fwrite("Invalid arguments.\n",0x13,1,_stderr);
        return 1;
      }
      pcVar11 = argv[1];
      if ((((*pcVar11 == '-') && (pcVar11[1] == 'h')) && (pcVar11[2] == '\0')) ||
         (iVar5 = strcmp(pcVar11,"--help"), iVar5 == 0)) {
        fprintf(_stdout,"Usage:\n\t%s [input-file] [output-file]\n",*argv);
        return 0;
      }
      pcVar12 = (char *)0x0;
LAB_00101352:
      __stream_00 = fopen(pcVar11,"r");
      pFVar9 = _stderr;
      if (__stream_00 == (FILE *)0x0) {
        piVar10 = __errno_location();
        pcVar12 = strerror(*piVar10);
        fprintf(pFVar9,"Failed to open \"%s\" for reading (%s).\n",pcVar11,pcVar12);
        return 1;
      }
      pcVar8 = strrchr(pcVar11,0x2f);
      if (pcVar8 == (char *)0x0) {
        pcVar11 = ".";
      }
      else {
        *pcVar8 = '\0';
      }
    }
    if (pcVar12 == (char *)0x0) goto LAB_00101410;
    pFVar9 = fopen(pcVar12,"w");
    pFVar13 = _stderr;
    if (__stream_00 == (FILE *)0x0) {
      piVar10 = __errno_location();
      pcVar11 = strerror(*piVar10);
      fprintf(pFVar13,"Failed to open \"%s\" for writing (%s).\n",pcVar12,pcVar11);
      iVar5 = 1;
      goto LAB_001014f4;
    }
  }
  import_modules = (char **)pFVar9;
  if (pFVar9 == (FILE *)0x0) {
    import_modules = (char **)_stdout;
  }
  name_space = (char *)__stream_00;
  if (__stream_00 == (FILE *)0x0) {
    name_space = (char *)_stdin;
  }
  local_40 = (char *)0x0;
  buf._4_4_ = 0;
  pcVar12 = get_word((FILE *)name_space,&local_40,(int *)((long)&buf + 4));
  iVar5 = -1;
  if (pcVar12 == (char *)0x0) {
    free(local_40);
  }
  else {
    local_68 = pFVar9;
    yVar6 = get_keyword(pcVar12,&local_6c);
    pcVar8 = name_space;
    pFVar9 = _stderr;
    if ((yVar6 == YANG_MODULE) || (yVar6 == YANG_SUBMODULE)) {
      pcVar12 = get_word((FILE *)name_space,&local_40,(int *)((long)&buf + 4));
      if ((pcVar12 == (char *)0x0) ||
         (iVar7 = find_namespace_imports
                            ((FILE *)pcVar8,&local_40,(int *)((long)&buf + 4),
                             (char **)&import_prefixes,&local_90,&stack0xffffffffffffffb0,
                             (char ***)&prefix,(int *)&local_54), ppcVar3 = import_prefixes,
         iVar7 != 0)) {
        free(local_40);
        pFVar9 = local_68;
        goto LAB_001014e7;
      }
      if (yVar6 == YANG_SUBMODULE) {
        pFVar9 = (FILE *)open_module((char *)import_prefixes,pcVar11);
        if (pFVar9 == (FILE *)0x0) {
          pFVar9 = (FILE *)0x0;
          fprintf(_stderr,"Failed to open the module \"%s\".\n",ppcVar3);
        }
        else {
          free(ppcVar3);
          import_prefixes = (char **)0x0;
          iVar5 = find_namespace_imports
                            ((FILE *)pFVar9,&local_40,(int *)((long)&buf + 4),
                             (char **)&import_prefixes,(char **)0x0,(char ***)0x0,(char ***)0x0,
                             (int *)0x0);
          if (iVar5 == 0) {
            fclose(pFVar9);
            goto LAB_00101573;
          }
        }
LAB_00101964:
        iVar5 = -1;
      }
      else {
LAB_00101573:
        lVar14 = 0;
        local_60 = __stream_00;
        for (lVar16 = 0; pcVar12 = name_space, lVar16 < (int)local_54; lVar16 = lVar16 + 1) {
          pFVar9 = (FILE *)open_module(*(char **)((long)ppcStack_50 + lVar14),pcVar11);
          if (pFVar9 == (FILE *)0x0) {
            pFVar9 = (FILE *)0x0;
            fprintf(_stderr,"Failed to open the module \"%s\".\n",
                    *(undefined8 *)((long)ppcStack_50 + lVar14));
            __stream_00 = local_60;
            goto LAB_00101964;
          }
          free(*(void **)((long)ppcStack_50 + lVar14));
          *(undefined8 *)((long)ppcStack_50 + lVar14) = 0;
          iVar5 = find_namespace_imports
                            ((FILE *)pFVar9,&local_40,(int *)((long)&buf + 4),
                             (char **)((long)ppcStack_50 + lVar14),(char **)0x0,(char ***)0x0,
                             (char ***)0x0,(int *)0x0);
          __stream_00 = local_60;
          if (iVar5 != 0) goto LAB_00101964;
          fclose(pFVar9);
          lVar14 = lVar14 + 8;
        }
        rewind((FILE *)name_space);
        fwrite("<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27,1,(FILE *)import_modules);
        pcVar11 = get_word((FILE *)pcVar12,&local_40,(int *)((long)&buf + 4));
        iVar5 = -1;
        if (pcVar11 == (char *)0x0) {
          pFVar9 = (FILE *)0x0;
          __stream_00 = local_60;
        }
        else {
          yVar6 = get_keyword(pcVar11,&local_6c);
          ppcVar4 = ppcStack_50;
          uVar1 = local_54;
          __stream_00 = local_60;
          ppcVar3 = import_prefixes;
          pcVar2 = prefix;
          pcVar8 = local_90;
          pFVar13 = _stderr;
          if ((yVar6 == YANG_MODULE) || (yVar6 == YANG_SUBMODULE)) {
            local_58 = local_6c;
            if (yVar6 == YANG_SUBMODULE) {
              fwrite("<submodule name=\"",0x11,1,(FILE *)import_modules);
              pcVar11 = "submodule";
LAB_00101788:
              if (local_6c != Y_IDENTIF_ARG) {
                fprintf(_stderr,"Int error (%d).\n",0x577);
                goto LAB_00101a37;
              }
              pcVar12 = get_word((FILE *)pcVar12,&local_40,(int *)((long)&buf + 4));
              __stream = import_modules;
              if (pcVar12 == (char *)0x0) goto LAB_00101a37;
              fprintf((FILE *)import_modules,"%s\"",pcVar12);
              lVar14 = (ulong)(yVar6 != YANG_MODULE) * 3 + 8;
              fprintf((FILE *)__stream,"\n%*sxmlns=\"urn:ietf:params:xml:ns:yang:yin:1\"",lVar14," "
                     );
              fprintf((FILE *)__stream,"\n%*sxmlns:%s=\"%s\"",lVar14," ",pcVar8,ppcVar3);
              if ((int)uVar1 < 1) {
                uVar1 = 0;
              }
              for (uVar15 = 0; in = (FILE *)name_space, uVar1 != uVar15; uVar15 = uVar15 + 1) {
                fprintf((FILE *)import_modules,"\n%*sxmlns:%s=\"%s\"",lVar14," ",
                        *(undefined8 *)(pcVar2 + uVar15 * 8),ppcVar4[uVar15]);
              }
              piVar10 = (int *)((long)&buf + 4);
              pcVar12 = get_word((FILE *)name_space,&local_40,piVar10);
              __stream_00 = local_60;
              if (pcVar12 == (char *)0x0) goto LAB_00101a37;
              yVar6 = get_keyword(pcVar12,&local_58);
              __stream_00 = local_60;
              pFVar9 = _stderr;
              if (yVar6 == YANG_LEFT_BRACE) {
                fwrite(">\n",2,1,(FILE *)import_modules);
                do {
                  pcVar12 = get_word(in,&local_40,piVar10);
                  if (pcVar12 == (char *)0x0) break;
                  yVar6 = get_keyword(pcVar12,&local_58);
                  in = (FILE *)name_space;
                  if (yVar6 == YANG_RIGHT_BRACE) {
                    pcVar8 = "</%s>\n";
                    iVar5 = 0;
                    pcVar12 = pcVar11;
                    pFVar9 = (FILE *)import_modules;
                    goto LAB_00101982;
                  }
                  if (yVar6 == YANG_UNKNOWN) {
                    pcVar11 = "Unexpected characters (\"%.20s\"...).\n";
                    pFVar13 = _stderr;
                    goto LAB_00101a30;
                  }
                  iVar5 = print_keyword(yVar6,local_58,(FILE *)import_modules,1,(FILE *)name_space,
                                        &local_40,piVar10);
                } while (iVar5 == 0);
                goto LAB_00101a37;
              }
              iVar5 = -1;
              if (yVar6 == YANG_UNKNOWN) {
                pcVar8 = "Unexpected characters (\"%.20s\"...).\n";
              }
              else {
                pcVar12 = keyword2str(yVar6);
                pcVar8 = "Unexpected keyword \"%s\".\n";
              }
LAB_00101982:
              fprintf(pFVar9,pcVar8,pcVar12);
            }
            else {
              if (yVar6 == YANG_MODULE) {
                fwrite("<module name=\"",0xe,1,(FILE *)import_modules);
                pcVar11 = "module";
                goto LAB_00101788;
              }
              pcVar12 = keyword2str(yVar6);
              pcVar11 = "Unexpected keyword \"%s\".\n";
LAB_00101a30:
              fprintf(pFVar13,pcVar11,pcVar12);
LAB_00101a37:
              iVar5 = -1;
            }
            pFVar9 = (FILE *)0x0;
          }
          else {
            if (yVar6 == YANG_UNKNOWN) {
              pcVar12 = "Unexpected characters (\"%.20s\"...).\n";
            }
            else {
              pcVar11 = keyword2str(yVar6);
              pcVar12 = "Unexpected keyword \"%s\".\n";
            }
            pFVar9 = (FILE *)0x0;
            fprintf(pFVar13,pcVar12,pcVar11);
          }
        }
      }
      free(import_prefixes);
      free(local_90);
      for (lVar14 = 0; lVar14 < (int)local_54; lVar14 = lVar14 + 1) {
        free(ppcStack_50[lVar14]);
        free(*(void **)(prefix + lVar14 * 8));
      }
      free(ppcStack_50);
      free(prefix);
      if (pFVar9 != (FILE *)0x0) {
        fclose(pFVar9);
      }
    }
    else {
      if (yVar6 == YANG_UNKNOWN) {
        pcVar11 = "Unexpected characters (\"%.20s\"...).\n";
      }
      else {
        pcVar12 = keyword2str(yVar6);
        pcVar11 = "Unexpected keyword \"%s\".\n";
      }
      fprintf(pFVar9,pcVar11,pcVar12);
    }
    free(local_40);
    pFVar9 = local_68;
  }
LAB_001014e7:
  if (__stream_00 != (FILE *)0x0) {
    fclose(__stream_00);
  }
LAB_001014f4:
  if (pFVar9 != (FILE *)0x0) {
    fclose(pFVar9);
  }
  return iVar5;
}

Assistant:

int
main(int argc, char **argv)
{
    const char *in_file = NULL, *out_file = NULL, *search_dir = ".";
    char *ptr;
    FILE *input = NULL, *output = NULL;
    int ret = 1;

    switch (argc) {
    case 1:
        break;
    case 2:
        if (!strcmp(argv[1], "-h") || !strcmp(argv[1], "--help")) {
            fprintf(stdout, "Usage:\n\t%s [input-file] [output-file]\n", argv[0]);
            return 0;
        }
        in_file = argv[1];
        break;
    case 3:
        in_file = argv[1];
        out_file = argv[2];
        break;
    default:
        fprintf(stderr, "Invalid arguments.\n");
        return 1;
    }

    if (in_file) {
        input = fopen(in_file, "r");
        if (!input) {
            fprintf(stderr, "Failed to open \"%s\" for reading (%s).\n", in_file, strerror(errno));
            goto cleanup;
        }

        if ((ptr = strrchr(in_file, '/'))) {
            *ptr = '\0';
            search_dir = in_file;
        }
    }
    if (out_file) {
        output = fopen(out_file, "w");
        if (!input) {
            fprintf(stderr, "Failed to open \"%s\" for writing (%s).\n", out_file, strerror(errno));
            goto cleanup;
        }
    }

    ret = convert_yang2yin(output ? output : stdout, input ? input : stdin, search_dir);

cleanup:
    if (input) {
        fclose(input);
    }
    if (output) {
        fclose(output);
    }
    return ret;
}